

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lambda.cpp
# Opt level: O1

int main(void)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  TaskPool *pTVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  arg_info *this;
  Workitem *pWVar8;
  Task *pTVar9;
  void *pvVar10;
  char *pcVar11;
  char *pcVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  SingleFunctor sf1;
  X y;
  arg_info *pargs_3;
  arg_info *pargs_2;
  X x;
  function<void_(int_&,_int)> g;
  function<void_(int_&)> f;
  reference_wrapper<int> local_b8;
  undefined8 local_b0;
  X local_a4;
  reference_wrapper<const_X> local_a0;
  arg_info *local_98;
  undefined8 local_90;
  X local_84;
  reference_wrapper<X> local_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  reference_wrapper<int> local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Using ",6);
  iVar6 = depspawn::get_num_threads();
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," threads\n",9);
  local_58._M_unused._M_object = (arg_info *)0x0;
  this = LinkedListPool<depspawn::internal::arg_info,_true,_false>::intl_malloc
                   ((LinkedListPool<depspawn::internal::arg_info,_true,_false> *)
                    depspawn::internal::arg_info::Pool);
  this->size = 4;
  this->wr = true;
  this->rank = '\0';
  this->addr = (value_t)&tmpresult;
  this->array_range = (array_range_t *)0x0;
  this->next = (arg_info *)0x0;
  depspawn::internal::arg_info::insert_in_arglist(this,(arg_info **)&local_58);
  if ((depspawn::internal::TP == (TaskPool *)0x0) || (depspawn::internal::TP->finish_ == true)) {
    depspawn::internal::start_master();
  }
  pWVar8 = LinkedListPool<depspawn::internal::Workitem,_true,_false>::intl_malloc
                     ((LinkedListPool<depspawn::internal::Workitem,_true,_false> *)
                      depspawn::internal::Workitem::Pool);
  depspawn::internal::Workitem::Workitem(pWVar8,(arg_info *)local_58._M_unused._0_8_,1);
  pTVar4 = depspawn::internal::TP;
  pTVar9 = LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false>::intl_malloc
                     (&depspawn::internal::TP->task_pool_);
  *(undefined8 *)&(pTVar9->func_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(pTVar9->func_).super__Function_base._M_functor + 8) = 0;
  (pTVar9->func_).super__Function_base._M_manager = (_Manager_type)0x0;
  (pTVar9->func_)._M_invoker = (_Invoker_type)0x0;
  pvVar10 = operator_new(0x18);
  *(undefined4 *)((long)pvVar10 + 8) = 99;
  *(int **)((long)pvVar10 + 0x10) = &tmpresult;
  *(void **)&(pTVar9->func_).super__Function_base._M_functor = pvVar10;
  (pTVar9->func_)._M_invoker =
       std::
       _Function_handler<void_(),_std::_Bind<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fraguela[P]depspawn/tests/test_lambda.cpp:80:9)_(std::reference_wrapper<int>,_int)>_>
       ::_M_invoke;
  (pTVar9->func_).super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_std::_Bind<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fraguela[P]depspawn/tests/test_lambda.cpp:80:9)_(std::reference_wrapper<int>,_int)>_>
       ::_M_manager;
  pTVar9->ctx_ = pWVar8;
  pTVar9->next = (Task *)pTVar4;
  depspawn::internal::Workitem::insert_in_worklist(pWVar8,pTVar9);
  local_58._M_unused._M_object = (arg_info *)0x0;
  iVar6 = depspawn::internal::
          fill_args<boost::mpl::v_iter<boost::function_types::parameter_types<void(int&,int_const&),boost::add_reference<mpl_::arg<_1>>>,0l>,int&,int&>
                    ((arg_info **)&local_58,&i,&tmpresult);
  if ((depspawn::internal::TP == (TaskPool *)0x0) || (depspawn::internal::TP->finish_ == true)) {
    depspawn::internal::start_master();
  }
  pWVar8 = LinkedListPool<depspawn::internal::Workitem,_true,_false>::intl_malloc
                     ((LinkedListPool<depspawn::internal::Workitem,_true,_false> *)
                      depspawn::internal::Workitem::Pool);
  depspawn::internal::Workitem::Workitem(pWVar8,(arg_info *)local_58._M_unused._0_8_,iVar6);
  pTVar4 = depspawn::internal::TP;
  pTVar9 = LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false>::intl_malloc
                     (&depspawn::internal::TP->task_pool_);
  *(undefined8 *)&(pTVar9->func_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(pTVar9->func_).super__Function_base._M_functor + 8) = 0;
  (pTVar9->func_).super__Function_base._M_manager = (_Manager_type)0x0;
  (pTVar9->func_)._M_invoker = (_Invoker_type)0x0;
  pvVar10 = operator_new(0x18);
  *(int **)((long)pvVar10 + 8) = &tmpresult;
  *(int **)((long)pvVar10 + 0x10) = &i;
  *(void **)&(pTVar9->func_).super__Function_base._M_functor = pvVar10;
  (pTVar9->func_)._M_invoker =
       std::
       _Function_handler<void_(),_std::_Bind<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fraguela[P]depspawn/tests/test_lambda.cpp:82:9)_(std::reference_wrapper<int>,_std::reference_wrapper<int>)>_>
       ::_M_invoke;
  (pTVar9->func_).super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_std::_Bind<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fraguela[P]depspawn/tests/test_lambda.cpp:82:9)_(std::reference_wrapper<int>,_std::reference_wrapper<int>)>_>
       ::_M_manager;
  pTVar9->ctx_ = pWVar8;
  pTVar9->next = (Task *)pTVar4;
  depspawn::internal::Workitem::insert_in_worklist(pWVar8,pTVar9);
  depspawn::wait_for_all();
  iVar3 = tmpresult;
  iVar6 = i;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"LAMBDA TEST ",0xc);
  bVar13 = iVar6 != 200 || iVar3 != 100;
  pcVar11 = "SUCCESSFUL";
  pcVar12 = "SUCCESSFUL";
  if (iVar6 != 200 || iVar3 != 100) {
    pcVar12 = "UNSUCCESSFUL";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar12,(ulong)bVar13 * 2 + 10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  local_84.v_ = 10;
  local_58._8_8_ = 0;
  local_58._M_unused._M_member_pointer = 10;
  pcStack_40 = std::_Function_handler<void_(int_&),_X>::_M_invoke;
  local_48 = std::_Function_handler<void_(int_&),_X>::_M_manager;
  local_78._8_8_ = 0;
  local_78._M_unused._M_member_pointer = 10;
  pcStack_60 = std::_Function_handler<void_(int_&,_int),_X>::_M_invoke;
  local_68 = std::_Function_handler<void_(int_&,_int),_X>::_M_manager;
  depspawn::spawn<std::function<void(int&)>,int&>((function<void_(int_&)> *)&local_58,&i);
  depspawn::spawn<std::function<void(int&)>,int&>((function<void_(int_&)> *)&local_58,&tmpresult);
  local_98 = (arg_info *)0x0;
  iVar6 = depspawn::internal::
          fill_args<boost::mpl::v_iter<boost::function_types::parameter_types<void(int&,int),boost::add_reference<mpl_::arg<_1>>>,0l>,int&,int&>
                    (&local_98,&i,&tmpresult);
  if ((depspawn::internal::TP == (TaskPool *)0x0) || (depspawn::internal::TP->finish_ == true)) {
    depspawn::internal::start_master();
  }
  pWVar8 = LinkedListPool<depspawn::internal::Workitem,_true,_false>::intl_malloc
                     ((LinkedListPool<depspawn::internal::Workitem,_true,_false> *)
                      depspawn::internal::Workitem::Pool);
  depspawn::internal::Workitem::Workitem(pWVar8,local_98,iVar6);
  local_b8._M_data = &i;
  local_a0._M_data = (X *)&tmpresult;
  pTVar9 = depspawn::internal::TaskPool::
           build_task<std::function<void(int&,int)>const&,std::reference_wrapper<int>,std::reference_wrapper<int>>
                     (depspawn::internal::TP,pWVar8,(function<void_(int_&,_int)> *)&local_78,
                      &local_b8,(reference_wrapper<int> *)&local_a0);
  depspawn::internal::Workitem::insert_in_worklist(pWVar8,pTVar9);
  depspawn::wait_for_all();
  bVar1 = i != 0x14a;
  bVar2 = tmpresult != 0x6e;
  bVar14 = bVar1 || bVar2;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"STD::FUNCTION TEST ",0x13);
  pcVar12 = "SUCCESSFUL";
  if (bVar1 || bVar2) {
    pcVar12 = "UNSUCCESSFUL";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar12,(ulong)bVar14 * 2 + 10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  local_a4.v_ = 5;
  local_98 = (arg_info *)X::sub;
  local_90 = 0;
  local_b8._M_data = (int *)X::sub;
  local_b0 = 0;
  local_a0._M_data = (X *)0x0;
  iVar6 = depspawn::internal::
          fill_args<boost::mpl::v_iter<boost::function_types::parameter_types<void(X&,int&),boost::add_reference<mpl_::arg<_1>>>,0l>,X&,int&>
                    ((arg_info **)&local_a0,&local_84,&i);
  if ((depspawn::internal::TP == (TaskPool *)0x0) || (depspawn::internal::TP->finish_ == true)) {
    depspawn::internal::start_master();
  }
  pWVar8 = LinkedListPool<depspawn::internal::Workitem,_true,_false>::intl_malloc
                     ((LinkedListPool<depspawn::internal::Workitem,_true,_false> *)
                      depspawn::internal::Workitem::Pool);
  depspawn::internal::Workitem::Workitem(pWVar8,(arg_info *)local_a0._M_data,iVar6);
  local_38._M_data = &i;
  local_80._M_data = &local_84;
  pTVar9 = depspawn::internal::TaskPool::
           build_task<void(X::*const&)(int&)const,std::reference_wrapper<X>,std::reference_wrapper<int>>
                     (depspawn::internal::TP,pWVar8,(offset_in_X_to_subr *)&local_b8,&local_80,
                      &local_38);
  depspawn::internal::Workitem::insert_in_worklist(pWVar8,pTVar9);
  local_b8._M_data = (int *)0x0;
  iVar6 = depspawn::internal::
          fill_args<boost::mpl::v_iter<boost::function_types::parameter_types<void(X&,int&),boost::add_reference<mpl_::arg<_1>>>,0l>,X_const&,int&>
                    ((arg_info **)&local_b8,&local_a4,&tmpresult);
  if ((depspawn::internal::TP == (TaskPool *)0x0) || (depspawn::internal::TP->finish_ == true)) {
    depspawn::internal::start_master();
  }
  pWVar8 = LinkedListPool<depspawn::internal::Workitem,_true,_false>::intl_malloc
                     ((LinkedListPool<depspawn::internal::Workitem,_true,_false> *)
                      depspawn::internal::Workitem::Pool);
  depspawn::internal::Workitem::Workitem(pWVar8,(arg_info *)local_b8._M_data,iVar6);
  local_80._M_data = (X *)&tmpresult;
  local_a0._M_data = &local_a4;
  pTVar9 = depspawn::internal::TaskPool::
           build_task<void(X::*const&)(int&)const,std::reference_wrapper<X_const>,std::reference_wrapper<int>>
                     (depspawn::internal::TP,pWVar8,(offset_in_X_to_subr *)&local_98,&local_a0,
                      (reference_wrapper<int> *)&local_80);
  depspawn::internal::Workitem::insert_in_worklist(pWVar8,pTVar9);
  local_98 = (arg_info *)X::operator();
  local_90 = 0;
  local_b8._M_data = (int *)0x0;
  iVar6 = depspawn::internal::
          fill_args<boost::mpl::v_iter<boost::function_types::parameter_types<void(X&,int&),boost::add_reference<mpl_::arg<_1>>>,0l>,X_const&,int&>
                    ((arg_info **)&local_b8,&local_a4,&i);
  if ((depspawn::internal::TP == (TaskPool *)0x0) || (depspawn::internal::TP->finish_ == true)) {
    depspawn::internal::start_master();
  }
  pWVar8 = LinkedListPool<depspawn::internal::Workitem,_true,_false>::intl_malloc
                     ((LinkedListPool<depspawn::internal::Workitem,_true,_false> *)
                      depspawn::internal::Workitem::Pool);
  depspawn::internal::Workitem::Workitem(pWVar8,(arg_info *)local_b8._M_data,iVar6);
  local_80._M_data = (X *)&i;
  local_a0._M_data = &local_a4;
  pTVar9 = depspawn::internal::TaskPool::
           build_task<void(X::*const&)(int&)const,std::reference_wrapper<X_const>,std::reference_wrapper<int>>
                     (depspawn::internal::TP,pWVar8,(offset_in_X_to_subr *)&local_98,&local_a0,
                      (reference_wrapper<int> *)&local_80);
  depspawn::internal::Workitem::insert_in_worklist(pWVar8,pTVar9);
  depspawn::wait_for_all();
  bVar1 = i != 0x145;
  bVar2 = tmpresult != 0x69;
  bVar15 = bVar1 || bVar2;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"PTR TO MEMBER FUNCTION TEST ",0x1c);
  pcVar12 = "SUCCESSFUL";
  if (bVar1 || bVar2) {
    pcVar12 = "UNSUCCESSFUL";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar12,(ulong)bVar15 * 2 + 10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  local_b8._M_data._0_4_ = 100;
  depspawn::spawn<SingleFunctor&,int&>((SingleFunctor *)&local_b8,&i);
  depspawn::spawn<SingleFunctor&,int&>((SingleFunctor *)&local_b8,&tmpresult);
  depspawn::spawn<SingleFunctor&,int&>((SingleFunctor *)&local_b8,&i);
  depspawn::wait_for_all();
  iVar3 = tmpresult;
  iVar6 = i;
  iVar5 = (int)local_b8._M_data;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FUNCTOR TEST ",0xd);
  if (iVar5 != 0x358 || (iVar6 != 0x147 || iVar3 != 0x6a)) {
    pcVar11 = "UNSUCCESSFUL";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar11,
             (ulong)(iVar5 != 0x358 || (iVar6 != 0x147 || iVar3 != 0x6a)) * 2 + 10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  return (uint)((bVar13 || bVar14) || bVar15);
}

Assistant:

int main()
{
  std::cout << "Using " << get_num_threads() << " threads\n";

  spawn([](int &r, const int& i) { r = i + 1; LOG("setting " << r); }, tmpresult, 99);
  
  spawn([](int &r, const int& i) { r = 2 * i; LOG("setting " << r); }, i, tmpresult);
  
  wait_for_all();

  const bool test_ok1 = (tmpresult == 100) && (i == 200);
  std::cout << "LAMBDA TEST " << (test_ok1 ? "SUCCESSFUL" : "UNSUCCESSFUL") << std::endl;
  
  X x(10);
  
  std::function<void(int&)> f = x;
  std::function<void(int&, int)> g = x;
  
  spawn(f, i);            // i = 200 + 10 = 210
  spawn(f, tmpresult);    // tmpresult = 100 + 10 = 110
  spawn(g, i, tmpresult); // i = 210 + 10 + 110 = 330
  
  wait_for_all();
  
  const bool test_ok2 = (tmpresult == 110) && (i == 330);
  std::cout << "STD::FUNCTION TEST " << (test_ok2 ? "SUCCESSFUL" : "UNSUCCESSFUL") << std::endl;
  
  const X y(5);
  
  void (X::*ptrmem)(int&) const;
  ptrmem = &X::sub;
  
  spawn(&X::sub, x, i);          // i = 330 - 10 = 320
  spawn(ptrmem, y, tmpresult);   // tmpresult = 110 - 5 = 105
  ptrmem = &X::operator();
  spawn(ptrmem, y, i);           // i = 320 + 5 = 325;
  
  wait_for_all();
  
  const bool test_ok3 = (tmpresult == 105) && (i == 325);
  std::cout << "PTR TO MEMBER FUNCTION TEST " << (test_ok3 ? "SUCCESSFUL" : "UNSUCCESSFUL") << std::endl;
  
  SingleFunctor sf1(100);
  spawn(sf1, i);         //sf1.v_ = 100 + 325 = 425;  i++= 326
  spawn(sf1, tmpresult); //sf1.v_ = 425 + 105 = 530;  tmpresult++= 106
  spawn(sf1, i);         //sf1.v_ = 530 + 326 = 856;  i++= 327
  wait_for_all();
  
  const bool test_ok4 = (tmpresult == 106) && (i == 327) && (sf1.value() == 856);
  std::cout << "FUNCTOR TEST " << (test_ok4 ? "SUCCESSFUL" : "UNSUCCESSFUL") << std::endl;
  
  return !(test_ok1 && test_ok2 && test_ok3);
}